

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O3

void __thiscall
TEST_TestHarness_c_checkPointerText_Test::~TEST_TestHarness_c_checkPointerText_Test
          (TEST_TestHarness_c_checkPointerText_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkPointerText)
{
    CHECK_EQUAL_C_POINTER_TEXT(NULLPTR, NULLPTR, "Text");
    fixture->setTestFunction(failPointerTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <0x0>\n\tbut was  <0x1>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: PointerTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}